

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fColorClearTest.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ColorClearCase::ColorClearCase
          (ColorClearCase *this,Context *context,char *name,int numIters,int numClearsMin,
          int numClearsMax,bool testAlpha,bool testScissoring,bool testColorMasks,
          bool firstClearFull)

{
  bool firstClearFull_local;
  bool testColorMasks_local;
  bool testScissoring_local;
  bool testAlpha_local;
  int numClearsMax_local;
  int numClearsMin_local;
  int numIters_local;
  char *name_local;
  Context *context_local;
  ColorClearCase *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,name);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ColorClearCase_032b1360;
  this->m_numIters = numIters;
  this->m_numClearsMin = numClearsMin;
  this->m_numClearsMax = numClearsMax;
  this->m_testAlpha = testAlpha;
  this->m_testScissoring = testScissoring;
  this->m_testColorMasks = testColorMasks;
  this->m_firstClearFull = firstClearFull;
  this->m_curIter = 0;
  return;
}

Assistant:

ColorClearCase(Context& context, const char* name, int numIters, int numClearsMin, int numClearsMax, bool testAlpha, bool testScissoring, bool testColorMasks, bool firstClearFull)
		: TestCase			(context, name, name)
		, m_numIters		(numIters)
		, m_numClearsMin	(numClearsMin)
		, m_numClearsMax	(numClearsMax)
		, m_testAlpha		(testAlpha)
		, m_testScissoring	(testScissoring)
		, m_testColorMasks	(testColorMasks)
		, m_firstClearFull	(firstClearFull)
	{
		m_curIter = 0;
	}